

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdaux.cpp
# Opt level: O0

SQRESULT sqstd_throwerrorf(HSQUIRRELVM v,SQChar *err,...)

{
  int iVar1;
  SQChar *__s;
  long lVar2;
  char *in_RSI;
  undefined8 in_RDI;
  SQInteger r;
  SQChar *b;
  va_list args;
  SQInteger n;
  SQChar *in_stack_ffffffffffffff08;
  HSQUIRRELVM in_stack_ffffffffffffff10;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  size_t local_20;
  char *local_18;
  undefined8 local_10;
  SQRESULT local_8;
  
  local_20 = 0x100;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x10;
    local_28 = &stack0xffffffffffffff08;
    __s = sq_getscratchpad(in_stack_ffffffffffffff10,(SQInteger)in_stack_ffffffffffffff08);
    iVar1 = vsnprintf(__s,local_20,local_18,&local_38);
    lVar2 = (long)iVar1;
    if (lVar2 < (long)local_20) break;
    local_20 = lVar2 + 1;
  }
  if (lVar2 < 0) {
    local_8 = sq_throwerror(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  return local_8;
}

Assistant:

SQRESULT sqstd_throwerrorf(HSQUIRRELVM v,const SQChar *err,...)
{
    SQInteger n=256;
    va_list args;
begin:
    va_start(args,err);
    SQChar *b=sq_getscratchpad(v,n);
    SQInteger r=scvsprintf(b,n,err,args);
    va_end(args);
    if (r>=n) {
        n=r+1;//required+null
        goto begin;
    } else if (r<0) {
        return sq_throwerror(v,_SC("@failed to generate formatted error message"));
    } else {
        return sq_throwerror(v,b);
    }
}